

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.cpp
# Opt level: O0

size_t Tools::leaf_index_nothrow(bitset_t *split)

{
  size_type sVar1;
  size_type sVar2;
  long lVar3;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff90;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffa0;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffa8;
  undefined8 local_8;
  
  sVar1 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count
                    (in_stack_ffffffffffffffa0);
  sVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RDI);
  if (sVar1 == sVar2 - 1) {
    sVar1 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RDI);
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator~
              (in_stack_ffffffffffffffa8);
    sVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_first
                      ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x1fffd0);
    lVar3 = sVar1 - sVar2;
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
              (in_stack_ffffffffffffff90);
  }
  else {
    sVar1 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RDI);
    sVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_first
                      ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x20002c);
    lVar3 = sVar1 - sVar2;
  }
  local_8 = lVar3 - 1;
  return local_8;
}

Assistant:

size_t Tools::leaf_index_nothrow(const bitset_t split) {
    if (split.count() == split.size() - 1) {
        return split.size() - (~split).find_first() - 1;
    } else {
        return split.size() - split.find_first() - 1;
    }
}